

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

int __thiscall
icu_63::SimpleTimeZone::clone
          (SimpleTimeZone *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SimpleTimeZone *this_00;
  undefined8 local_30;
  SimpleTimeZone *this_local;
  
  this_00 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)__fn);
  local_30 = (SimpleTimeZone *)0x0;
  if (this_00 != (SimpleTimeZone *)0x0) {
    SimpleTimeZone(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

TimeZone*
SimpleTimeZone::clone() const
{
    return new SimpleTimeZone(*this);
}